

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitNumericConstant
          (ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,NumericConstant c)

{
  NumericConstant::value((NumericConstant *)0x4e6c35);
  fmt::BasicWriter<char>::operator<<
            ((BasicWriter<char> *)
             c.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_,
             (double)this);
  return;
}

Assistant:

void VisitNumericConstant(NumericConstant c) { writer_ << c.value(); }